

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::operator==
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,
          IFF_ATC_NAVAIDS_FundamentalParameterData *Value)

{
  if (((((((float)this->m_f32ERP == (float)Value->m_f32ERP) &&
         (!NAN((float)this->m_f32ERP) && !NAN((float)Value->m_f32ERP))) &&
        ((float)this->m_f32Freq == (float)Value->m_f32Freq)) &&
       ((!NAN((float)this->m_f32Freq) && !NAN((float)Value->m_f32Freq) &&
        ((float)this->m_f32PgRF == (float)Value->m_f32PgRF)))) &&
      ((!NAN((float)this->m_f32PgRF) && !NAN((float)Value->m_f32PgRF) &&
       (((float)this->m_f32PulseWidth == (float)Value->m_f32PulseWidth &&
        (!NAN((float)this->m_f32PulseWidth) && !NAN((float)Value->m_f32PulseWidth))))))) &&
     (this->m_ui32BurstLength == Value->m_ui32BurstLength)) {
    return this->m_ui8AppMode == Value->m_ui8AppMode;
  }
  return false;
}

Assistant:

KBOOL IFF_ATC_NAVAIDS_FundamentalParameterData::operator == ( const IFF_ATC_NAVAIDS_FundamentalParameterData & Value ) const
{
    if( m_f32ERP           != Value.m_f32ERP )           return false;
    if( m_f32Freq          != Value.m_f32Freq )          return false;
    if( m_f32PgRF          != Value.m_f32PgRF )          return false;
    if( m_f32PulseWidth    != Value.m_f32PulseWidth )    return false;
    if( m_ui32BurstLength  != Value.m_ui32BurstLength )  return false;
    if( m_ui8AppMode       != Value.m_ui8AppMode )       return false;
    return true;
}